

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O0

void aes_ctr_xor(aes_context *context,uint8_t *iv,uint64_t block,uint8_t *buffer,size_t size)

{
  char cVar1;
  int iVar2;
  ulong local_70;
  size_t i_3;
  uint local_60;
  int i_2;
  uint32_t i_1;
  uint32_t i;
  uint8_t counter [16];
  uint8_t tmp [16];
  ulong local_30;
  size_t size_local;
  uint8_t *buffer_local;
  uint64_t block_local;
  uint8_t *iv_local;
  aes_context *context_local;
  
  for (i_2 = 0; (uint)i_2 < 0x10; i_2 = i_2 + 1) {
    *(uint8_t *)((long)&i_1 + (ulong)(uint)i_2) = iv[(uint)i_2];
  }
  ctr_add((uint8_t *)&i_1,block);
  iVar2 = aes_supported_x86();
  local_30 = size;
  size_local = (size_t)buffer;
  if (iVar2 == 0) {
    for (; 0xf < local_30; local_30 = local_30 - 0x10) {
      aes_encrypt(context,(uint8_t *)&i_1,counter + 8);
      for (local_60 = 0; local_60 < 0x10; local_60 = local_60 + 1) {
        *(byte *)size_local = *(byte *)size_local ^ counter[(ulong)local_60 + 8];
        size_local = size_local + 1;
      }
      i_3._4_4_ = 0xf;
      while ((-1 < i_3._4_4_ &&
             (cVar1 = *(char *)((long)&i_1 + (long)i_3._4_4_) + '\x01',
             *(char *)((long)&i_1 + (long)i_3._4_4_) = cVar1, cVar1 == '\0'))) {
        i_3._4_4_ = i_3._4_4_ + -1;
      }
    }
    if (local_30 != 0) {
      aes_encrypt(context,(uint8_t *)&i_1,counter + 8);
      for (local_70 = 0; local_70 < local_30; local_70 = local_70 + 1) {
        *(byte *)size_local = *(byte *)size_local ^ counter[local_70 + 8];
        size_local = size_local + 1;
      }
    }
  }
  else {
    aes_ctr_xor_x86(context,(uint8_t *)&i_1,buffer,size);
  }
  return;
}

Assistant:

void aes_ctr_xor(const aes_context* context, const uint8_t* iv, uint64_t block, uint8_t* buffer, size_t size)
{
    uint8_t tmp[16];
    uint8_t counter[16];
    for (uint32_t i=0; i<16; i++)
    {
        counter[i] = iv[i];
    }
    ctr_add(counter, block);

#if PLATFORM_SUPPORTS_AESNI
    if (aes_supported_x86())
    {
        aes_ctr_xor_x86(context, counter, buffer, size);
        return;
    }
#endif

    while (size >= 16)
    {
        aes_encrypt(context, counter, tmp);
        for (uint32_t i=0; i<16; i++)
        {
            *buffer++ ^= tmp[i];
        }
        for (int i=15; i>=0; i--)
            if (++counter[i] != 0)
                break;
        size -= 16;
    }

    if (size != 0)
    {
        aes_encrypt(context, counter, tmp);
        for (size_t i=0; i<size; i++)
        {
            *buffer++ ^= tmp[i];
        }
    }
}